

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O3

SatType __thiscall features::Surf::filter_dyy(Surf *this,int fs,int x,int y)

{
  int iVar1;
  int iVar2;
  element_type *peVar3;
  pointer plVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  peVar3 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar6 = (peVar3->super_TypedImageBase<long>).super_ImageBase.w;
  iVar7 = ((~fs - fs / 2) + y) * iVar6;
  iVar5 = (x - fs) + iVar7;
  iVar6 = iVar6 * fs;
  iVar1 = iVar5 + iVar6;
  iVar2 = iVar1 + iVar6;
  plVar4 = (peVar3->super_TypedImageBase<long>).data.super__Vector_base<long,_std::allocator<long>_>
           ._M_impl.super__Vector_impl_data._M_start;
  return (((plVar4[iVar2] + plVar4[(long)(iVar1 + fs * 2) + 0xffffffffffffffff]) * 3 + plVar4[iVar5]
          ) - (plVar4[iVar1] + plVar4[iVar6 + iVar2] +
               plVar4[(long)(x + fs + iVar7) + 0xffffffffffffffff] +
              plVar4[(long)(iVar2 + fs * 2) + 0xffffffffffffffff])) +
         plVar4[(long)(iVar6 + iVar2 + fs * 2) + 0xffffffffffffffff] +
         plVar4[iVar1] * -2 + plVar4[(long)(iVar2 + fs * 2) + 0xffffffffffffffff] * -2;
}

Assistant:

Surf::SatType
Surf::filter_dyy (int fs, int x, int y)
{
    int const w = this->sat->width();
    int const fs2 = fs / 2;
    int const row1 = (x - fs) + w * (y - fs - fs2 - 1);
    int const row2 = row1 + w * fs;
    int const row3 = row2 + w * fs;
    int const row4 = row3 + w * fs;

    Surf::SatType const v0 = this->sat->at(row1);
    Surf::SatType const v1 = this->sat->at(row2);
    Surf::SatType const v2 = this->sat->at(row3);
    Surf::SatType const v3 = this->sat->at(row4);
    Surf::SatType const v4 = this->sat->at(row1 + fs + fs - 1);
    Surf::SatType const v5 = this->sat->at(row2 + fs + fs - 1);
    Surf::SatType const v6 = this->sat->at(row3 + fs + fs - 1);
    Surf::SatType const v7 = this->sat->at(row4 + fs + fs - 1);

    Surf::SatType ret = 0;
    ret += v5 + v0 - v1 - v4;
    ret -= 2 * (v6 + v1 - v2 - v5);
    ret += v7 + v2 - v3 - v6;
    return ret;
}